

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 572_subtreeOfAnotherTreeElegantSol.cpp
# Opt level: O2

int main(void)

{
  TreeNode *s;
  TreeNode *pTVar1;
  TreeNode *pTVar2;
  ostream *poVar3;
  
  s = (TreeNode *)operator_new(0x18);
  s->val = 1;
  s->left = (TreeNode *)0x0;
  s->right = (TreeNode *)0x0;
  pTVar1 = (TreeNode *)operator_new(0x18);
  pTVar1->val = 1;
  pTVar1->left = (TreeNode *)0x0;
  pTVar1->right = (TreeNode *)0x0;
  s->left = pTVar1;
  pTVar2 = (TreeNode *)operator_new(0x18);
  pTVar2->val = 2;
  pTVar2->left = (TreeNode *)0x0;
  pTVar2->right = (TreeNode *)0x0;
  pTVar1->left = pTVar2;
  pTVar1 = (TreeNode *)operator_new(0x18);
  pTVar1->val = 1;
  pTVar1->left = (TreeNode *)0x0;
  pTVar1->right = (TreeNode *)0x0;
  treeTraversal(s,pTVar1);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main()
{
	TreeNode* s = new TreeNode(1);
	s->left = new TreeNode(1);
    s->left->left = new TreeNode(2);

	TreeNode* t = new TreeNode(1);

	cout<<isSubtree(s,t)<<endl;

}